

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Accumulate(void *origin_addr,int origin_count,MPIABI_Datatype origin_datatype,
                     int target_rank,MPIABI_Aint target_disp,int target_count,
                     MPIABI_Datatype target_datatype,MPIABI_Op op,MPIABI_Win win)

{
  int iVar1;
  
  iVar1 = MPI_Accumulate();
  return iVar1;
}

Assistant:

int MPIABI_Accumulate(
  const void * origin_addr,
  int origin_count,
  MPIABI_Datatype origin_datatype,
  int target_rank,
  MPIABI_Aint target_disp,
  int target_count,
  MPIABI_Datatype target_datatype,
  MPIABI_Op op,
  MPIABI_Win win
) {
  return MPI_Accumulate(
    origin_addr,
    origin_count,
    (MPI_Datatype)(WPI_Datatype)origin_datatype,
    target_rank,
    (MPI_Aint)(WPI_Aint)target_disp,
    target_count,
    (MPI_Datatype)(WPI_Datatype)target_datatype,
    (MPI_Op)(WPI_Op)op,
    (MPI_Win)(WPI_Win)win
  );
}